

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O0

void __thiscall serialization::xml_oarchive::save_sequence_start(xml_oarchive *this,size_type size)

{
  char *pcVar1;
  xml_attribute<char> *attribute;
  memory_pool<char> *this_00;
  string local_48;
  xml_attribute<char> *local_28;
  xml_attribute<char> *attr;
  xml_node<char> *node;
  serialization_trace trace;
  xml_oarchive *pxStack_10;
  size_type size_local;
  xml_oarchive *this_local;
  
  node._4_4_ = size;
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[20],char_const(&)[4]>
            ((serialization_trace *)((long)&node + 3),(char (*) [20])"save_sequence_start",
             (char (*) [4])"xml");
  this_00 = &(this->document_).super_memory_pool<char>;
  attr = (xml_attribute<char> *)
         rapidxml::memory_pool<char>::allocate_node(this_00,node_element,"sequence",(char *)0x0,0,0)
  ;
  std::__cxx11::to_string(&local_48,node._4_4_);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = rapidxml::memory_pool<char>::allocate_string(this_00,pcVar1,0);
  attribute = rapidxml::memory_pool<char>::allocate_attribute(this_00,"size",pcVar1,0,0);
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = attribute;
  rapidxml::xml_node<char>::append_attribute((xml_node<char> *)attr,attribute);
  rapidxml::xml_node<char>::append_node(this->current_,(xml_node<char> *)attr);
  this->current_ = (xml_node<char> *)attr;
  return;
}

Assistant:

void save_sequence_start(size_type size)
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "sequence");
        auto attr = document_.allocate_attribute("size", document_.allocate_string(std::to_string(size).c_str()));
        node->append_attribute(attr);
        current_->append_node(node);
        current_ = node;
    }